

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void DoFilter(VP8Decoder *dec,int mb_x,int mb_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int hev_thresh;
  uint8_t *v_dst;
  uint8_t *u_dst;
  int uv_bps;
  int limit;
  int ilevel;
  uint8_t *y_dst;
  VP8FInfo *f_info;
  int y_bps;
  int cache_id;
  VP8ThreadContext *ctx;
  
  iVar1 = *(int *)(in_RDI + 0xd8);
  iVar2 = *(int *)(in_RDI + 0xb40);
  pbVar6 = (byte *)(*(long *)(in_RDI + 0xe8) + (long)in_ESI * 4);
  puVar7 = (uint8_t *)
           (*(long *)(in_RDI + 0xb28) + (long)(iVar1 * 0x10 * iVar2) + (long)(in_ESI << 4));
  uVar5 = (uint)*pbVar6;
  if (uVar5 != 0) {
    if (*(int *)(in_RDI + 0xb68) == 1) {
      if (0 < in_ESI) {
        (*VP8SimpleHFilter16)(puVar7,iVar2,uVar5 + 4);
      }
      if (pbVar6[2] != 0) {
        (*VP8SimpleHFilter16i)(puVar7,iVar2,uVar5);
      }
      if (0 < in_EDX) {
        (*VP8SimpleVFilter16)(puVar7,iVar2,uVar5 + 4);
      }
      if (pbVar6[2] != 0) {
        (*VP8SimpleVFilter16i)(puVar7,iVar2,uVar5);
      }
    }
    else {
      iVar3 = *(int *)(in_RDI + 0xb44);
      puVar8 = (uint8_t *)
               (*(long *)(in_RDI + 0xb30) + (long)(iVar1 * 8 * iVar3) + (long)(in_ESI << 3));
      puVar9 = (uint8_t *)
               (*(long *)(in_RDI + 0xb38) + (long)(iVar1 * 8 * iVar3) + (long)(in_ESI << 3));
      iVar1 = (int)pbVar6[1];
      iVar4 = (int)pbVar6[3];
      if (0 < in_ESI) {
        (*VP8HFilter16)(puVar7,iVar2,uVar5 + 4,iVar1,iVar4);
        (*VP8HFilter8)(puVar8,puVar9,iVar3,uVar5 + 4,iVar1,iVar4);
      }
      if (pbVar6[2] != 0) {
        (*VP8HFilter16i)(puVar7,iVar2,uVar5,iVar1,iVar4);
        (*VP8HFilter8i)(puVar8,puVar9,iVar3,uVar5,iVar1,iVar4);
      }
      if (0 < in_EDX) {
        (*VP8VFilter16)(puVar7,iVar2,uVar5 + 4,iVar1,iVar4);
        (*VP8VFilter8)(puVar8,puVar9,iVar3,uVar5 + 4,iVar1,iVar4);
      }
      if (pbVar6[2] != 0) {
        (*VP8VFilter16i)(puVar7,iVar2,uVar5,iVar1,iVar4);
        (*VP8VFilter8i)(puVar8,puVar9,iVar3,uVar5,iVar1,iVar4);
      }
    }
  }
  return;
}

Assistant:

static void DoFilter(const VP8Decoder* const dec, int mb_x, int mb_y) {
  const VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int cache_id = ctx->id_;
  const int y_bps = dec->cache_y_stride_;
  const VP8FInfo* const f_info = ctx->f_info_ + mb_x;
  uint8_t* const y_dst = dec->cache_y_ + cache_id * 16 * y_bps + mb_x * 16;
  const int ilevel = f_info->f_ilevel_;
  const int limit = f_info->f_limit_;
  if (limit == 0) {
    return;
  }
  assert(limit >= 3);
  if (dec->filter_type_ == 1) {   // simple
    if (mb_x > 0) {
      VP8SimpleHFilter16(y_dst, y_bps, limit + 4);
    }
    if (f_info->f_inner_) {
      VP8SimpleHFilter16i(y_dst, y_bps, limit);
    }
    if (mb_y > 0) {
      VP8SimpleVFilter16(y_dst, y_bps, limit + 4);
    }
    if (f_info->f_inner_) {
      VP8SimpleVFilter16i(y_dst, y_bps, limit);
    }
  } else {    // complex
    const int uv_bps = dec->cache_uv_stride_;
    uint8_t* const u_dst = dec->cache_u_ + cache_id * 8 * uv_bps + mb_x * 8;
    uint8_t* const v_dst = dec->cache_v_ + cache_id * 8 * uv_bps + mb_x * 8;
    const int hev_thresh = f_info->hev_thresh_;
    if (mb_x > 0) {
      VP8HFilter16(y_dst, y_bps, limit + 4, ilevel, hev_thresh);
      VP8HFilter8(u_dst, v_dst, uv_bps, limit + 4, ilevel, hev_thresh);
    }
    if (f_info->f_inner_) {
      VP8HFilter16i(y_dst, y_bps, limit, ilevel, hev_thresh);
      VP8HFilter8i(u_dst, v_dst, uv_bps, limit, ilevel, hev_thresh);
    }
    if (mb_y > 0) {
      VP8VFilter16(y_dst, y_bps, limit + 4, ilevel, hev_thresh);
      VP8VFilter8(u_dst, v_dst, uv_bps, limit + 4, ilevel, hev_thresh);
    }
    if (f_info->f_inner_) {
      VP8VFilter16i(y_dst, y_bps, limit, ilevel, hev_thresh);
      VP8VFilter8i(u_dst, v_dst, uv_bps, limit, ilevel, hev_thresh);
    }
  }
}